

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               less_equal *comp)

{
  void *pvVar1;
  bool bVar2;
  xpath_node *pxVar3;
  xpath_node *pxVar4;
  undefined8 *in_RCX;
  xpath_ast_node *in_RSI;
  xpath_ast_node *in_RDI;
  void *in_R8;
  xpath_allocator_capture cri_2;
  xpath_node *li_1;
  double r;
  xpath_node_set_raw ls_1;
  xpath_allocator_capture cr_2;
  xpath_allocator_capture cri_1;
  xpath_node *ri_1;
  xpath_node_set_raw rs_1;
  double l_1;
  xpath_allocator_capture cr_1;
  xpath_allocator_capture crii;
  xpath_node *ri;
  double l;
  xpath_allocator_capture cri;
  xpath_node *li;
  xpath_node_set_raw rs;
  xpath_node_set_raw ls;
  xpath_allocator_capture cr;
  xpath_value_type rt;
  xpath_value_type lt;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  xpath_allocator *in_stack_fffffffffffffd48;
  xpath_allocator *in_stack_fffffffffffffd50;
  xpath_string local_270;
  double in_stack_fffffffffffffda8;
  nodeset_eval_t eval;
  xpath_allocator *in_stack_fffffffffffffdb0;
  xpath_memory_block *in_stack_fffffffffffffdb8;
  xpath_ast_node *in_stack_fffffffffffffdc0;
  xpath_node *local_230;
  double local_228;
  xpath_node_set_raw local_220;
  xpath_allocator_capture local_200;
  xpath_string local_1e0;
  double local_1c8;
  xpath_allocator_capture local_1c0;
  xpath_node *local_1a0;
  xpath_node_set_raw local_198;
  double local_178;
  xpath_allocator_capture local_170;
  uint local_14c;
  xpath_string local_148;
  double local_130;
  xpath_allocator_capture local_128;
  xpath_allocator *local_108;
  xpath_string local_100;
  double local_e8;
  xpath_allocator_capture local_e0;
  xpath_node *local_c0;
  xpath_node_set_raw local_b8;
  xpath_stack *in_stack_ffffffffffffff68;
  xpath_context *in_stack_ffffffffffffff70;
  xpath_ast_node *in_stack_ffffffffffffff78;
  xpath_allocator_capture local_68;
  double local_48;
  double local_40;
  xpath_value_type local_38;
  xpath_value_type local_34;
  void *local_30;
  undefined8 *local_28;
  xpath_ast_node *local_18;
  byte local_1;
  
  eval = (nodeset_eval_t)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_34 = rettype(in_RDI);
  local_38 = rettype(local_18);
  if ((local_34 == xpath_type_node_set) || (local_38 == xpath_type_node_set)) {
    if ((local_34 == xpath_type_node_set) && (local_38 == xpath_type_node_set)) {
      xpath_allocator_capture::xpath_allocator_capture(&local_68,(xpath_allocator *)*local_28);
      eval_node_set(in_stack_fffffffffffffdc0,(xpath_context *)in_stack_fffffffffffffdb8,
                    (xpath_stack *)in_stack_fffffffffffffdb0,eval);
      eval_node_set(in_stack_fffffffffffffdc0,(xpath_context *)in_stack_fffffffffffffdb8,
                    (xpath_stack *)in_stack_fffffffffffffdb0,eval);
      for (local_c0 = xpath_node_set_raw::begin((xpath_node_set_raw *)&stack0xffffffffffffff78);
          pxVar4 = local_c0,
          pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&stack0xffffffffffffff78),
          pxVar4 != pxVar3; local_c0 = local_c0 + 1) {
        xpath_allocator_capture::xpath_allocator_capture(&local_e0,(xpath_allocator *)*local_28);
        string_value((xpath_node *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        xpath_string::c_str(&local_100);
        local_e8 = convert_string_to_number
                             ((char_t *)
                              CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
        local_108 = (xpath_allocator *)xpath_node_set_raw::begin(&local_b8);
        while (in_stack_fffffffffffffd48 = local_108,
              in_stack_fffffffffffffd50 = (xpath_allocator *)xpath_node_set_raw::end(&local_b8),
              in_stack_fffffffffffffd48 != in_stack_fffffffffffffd50) {
          xpath_allocator_capture::xpath_allocator_capture(&local_128,(xpath_allocator *)*local_28);
          pvVar1 = local_30;
          string_value((xpath_node *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
          xpath_string::c_str(&local_148);
          local_130 = convert_string_to_number
                                ((char_t *)
                                 CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
          bVar2 = (anonymous_namespace)::less_equal::operator()(pvVar1,&local_e8,&local_130);
          if (bVar2) {
            local_1 = 1;
          }
          local_14c = (uint)bVar2;
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x140362);
          if (local_14c != 0) goto LAB_00140395;
          local_108 = (xpath_allocator *)&local_108->_error;
        }
        local_14c = 0;
LAB_00140395:
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x1403a2);
        if (local_14c != 0) goto LAB_001403ec;
      }
      local_1 = 0;
      local_14c = 1;
LAB_001403ec:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x1403f9);
    }
    else if ((local_34 == xpath_type_node_set) || (local_38 != xpath_type_node_set)) {
      if ((local_34 == xpath_type_node_set) && (local_38 != xpath_type_node_set)) {
        xpath_allocator_capture::xpath_allocator_capture(&local_200,(xpath_allocator *)*local_28);
        eval_node_set(in_stack_fffffffffffffdc0,(xpath_context *)in_stack_fffffffffffffdb8,
                      (xpath_stack *)in_stack_fffffffffffffdb0,eval);
        local_228 = eval_number(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff68);
        for (local_230 = xpath_node_set_raw::begin(&local_220);
            pxVar4 = xpath_node_set_raw::end(&local_220), local_230 != pxVar4;
            local_230 = local_230 + 1) {
          xpath_allocator_capture::xpath_allocator_capture
                    ((xpath_allocator_capture *)&stack0xfffffffffffffdb0,
                     (xpath_allocator *)*local_28);
          pvVar1 = local_30;
          string_value((xpath_node *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
          xpath_string::c_str(&local_270);
          convert_string_to_number
                    ((char_t *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
          in_stack_fffffffffffffcaf =
               (anonymous_namespace)::less_equal::operator()
                         (pvVar1,(double *)&stack0xfffffffffffffda8,&local_228);
          if ((bool)in_stack_fffffffffffffcaf) {
            local_1 = 1;
          }
          local_14c = (uint)(byte)in_stack_fffffffffffffcaf;
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x14085f);
          if (local_14c != 0) goto LAB_0014089a;
        }
        local_1 = 0;
        local_14c = 1;
LAB_0014089a:
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x1408a7);
      }
      else {
        local_1 = 0;
      }
    }
    else {
      xpath_allocator_capture::xpath_allocator_capture(&local_170,(xpath_allocator *)*local_28);
      local_178 = eval_number(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff68);
      eval_node_set(in_stack_fffffffffffffdc0,(xpath_context *)in_stack_fffffffffffffdb8,
                    (xpath_stack *)in_stack_fffffffffffffdb0,eval);
      for (local_1a0 = xpath_node_set_raw::begin(&local_198); pxVar4 = local_1a0,
          pxVar3 = xpath_node_set_raw::end(&local_198), pxVar4 != pxVar3; local_1a0 = local_1a0 + 1)
      {
        xpath_allocator_capture::xpath_allocator_capture(&local_1c0,(xpath_allocator *)*local_28);
        pvVar1 = local_30;
        string_value((xpath_node *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        xpath_string::c_str(&local_1e0);
        local_1c8 = convert_string_to_number
                              ((char_t *)
                               CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
        bVar2 = (anonymous_namespace)::less_equal::operator()(pvVar1,&local_178,&local_1c8);
        if (bVar2) {
          local_1 = 1;
        }
        local_14c = (uint)bVar2;
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x140608);
        if (local_14c != 0) goto LAB_00140643;
      }
      local_1 = 0;
      local_14c = 1;
LAB_00140643:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x140650);
    }
  }
  else {
    local_40 = eval_number(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68);
    local_48 = eval_number(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68);
    local_1 = (anonymous_namespace)::less_equal::operator()(local_30,&local_40,&local_48);
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool compare_rel(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
				return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					double l = convert_string_to_number(string_value(*li, stack.result).c_str());

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture crii(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}
				}

				return false;
			}
			else if (lt != xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				double l = lhs->eval_number(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
						return true;
				}

				return false;
			}
			else if (lt == xpath_type_node_set && rt != xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				double r = rhs->eval_number(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(convert_string_to_number(string_value(*li, stack.result).c_str()), r))
						return true;
				}

				return false;
			}
			else
			{
				assert(false && "Wrong types"); // unreachable
				return false;
			}
		}